

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.h
# Opt level: O0

_Bool upb_MiniTableEnum_CheckValue(upb_MiniTableEnum *e,uint32_t val)

{
  uint32_t *local_50;
  uint32_t *p;
  uint32_t *limit;
  uint32_t *start;
  uint32_t bit_1;
  uint32_t mask_1;
  uint64_t bit;
  uint64_t mask;
  uint32_t val_local;
  upb_MiniTableEnum *e_local;
  
  if (val < 0x40) {
    e_local._7_1_ = ((ulong)e[1] & 1L << ((byte)val & 0x3f)) != 0;
  }
  else if (val < e->mask_limit_dont_copy_me__upb_internal_use_only) {
    e_local._7_1_ =
         ((&e[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] &
         (uint)(1L << ((byte)val & 0x1f))) != 0;
  }
  else {
    for (local_50 = &e[1].mask_limit_dont_copy_me__upb_internal_use_only +
                    (e->mask_limit_dont_copy_me__upb_internal_use_only >> 5);
        local_50 <
        &e[1].mask_limit_dont_copy_me__upb_internal_use_only +
        ((e->mask_limit_dont_copy_me__upb_internal_use_only >> 5) +
        e->value_count_dont_copy_me__upb_internal_use_only); local_50 = local_50 + 1) {
      if (*local_50 == val) {
        return true;
      }
    }
    e_local._7_1_ = false;
  }
  return e_local._7_1_;
}

Assistant:

UPB_API_INLINE bool upb_MiniTableEnum_CheckValue(
    const struct upb_MiniTableEnum* e, uint32_t val) {
  if (UPB_LIKELY(val < 64)) {
    const uint64_t mask =
        e->UPB_PRIVATE(data)[0] | ((uint64_t)e->UPB_PRIVATE(data)[1] << 32);
    const uint64_t bit = 1ULL << val;
    return (mask & bit) != 0;
  }
  if (UPB_LIKELY(val < e->UPB_PRIVATE(mask_limit))) {
    const uint32_t mask = e->UPB_PRIVATE(data)[val / 32];
    const uint32_t bit = 1ULL << (val % 32);
    return (mask & bit) != 0;
  }

  // OPT: binary search long lists?
  const uint32_t* start =
      &e->UPB_PRIVATE(data)[e->UPB_PRIVATE(mask_limit) / 32];
  const uint32_t* limit = &e->UPB_PRIVATE(
      data)[e->UPB_PRIVATE(mask_limit) / 32 + e->UPB_PRIVATE(value_count)];
  for (const uint32_t* p = start; p < limit; p++) {
    if (*p == val) return true;
  }
  return false;
}